

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitions
          (MemorySSATransformation *this,RWNode *node,DefSite *ds)

{
  RWNode *in_RDX;
  Definitions *in_RDI;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions D;
  RWBBlock *block;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *defs;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_fffffffffffffec8;
  DefSite *in_stack_fffffffffffffef0;
  Definitions *in_stack_fffffffffffffef8;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffff10;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_stack_ffffffffffffff18;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_stack_ffffffffffffff20;
  const_iterator in_stack_ffffffffffffff28;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffff80;
  DefSite *in_stack_ffffffffffffff88;
  Definitions *in_stack_ffffffffffffff90;
  RWBBlock *in_stack_ffffffffffffff98;
  MemorySSATransformation *in_stack_ffffffffffffffa0;
  
  RWNode::getBBlock(in_RDX);
  findDefinitionsInBlock
            ((RWNode *)in_stack_ffffffffffffff28._M_current,
             (RWNode *)in_stack_ffffffffffffff20._M_node);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x1734ae);
  Definitions::get(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
  ::__normal_iterator<dg::dda::RWNode**>
            ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_RDI,
             (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_stack_fffffffffffffec8);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  begin(in_stack_fffffffffffffec8);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::end
            (in_stack_fffffffffffffec8);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  addUncoveredFromPredecessors
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
       0x173558);
  Definitions::~Definitions(in_RDI);
  return (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitions(RWNode *node, const DefSite &ds) {
    DBG(dda, "Searching definitions for node " << node->getID());

    // we use this only for PHI nodes
    assert(ds.target && "Target is null");
    assert(!ds.target->isUnknown() && "Searching unknown memory");

    auto *block = node->getBBlock();
    assert(block && "Need bblock");

    // gather all definitions from the beginning of the block
    // to the node (we must do that always, because adding PHI
    // nodes changes the definitions)
    auto D = findDefinitionsInBlock(node);
    std::vector<RWNode *> defs;

    // add the definitions from the beginning of this block to the defs
    // container
    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    defs.insert(defs.end(), defSet.begin(), defSet.end());

    addUncoveredFromPredecessors(block, D, ds, defs);

    return defs;
}